

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

RenderSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
          *samples)

{
  pointer pRVar1;
  pointer pRVar2;
  ulong uVar3;
  SampleBuilder *pSVar4;
  ulong uVar5;
  offset_in_SampleType_to_deUint64 in_RCX;
  deUint64 *pdVar6;
  int *piVar7;
  string *psVar8;
  LogNumber<float> *pLVar9;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  void *__buf_16;
  void *__buf_17;
  void *__buf_18;
  void *__buf_19;
  void *__buf_20;
  void *__buf_21;
  void *__buf_22;
  void *__buf_23;
  void *__buf_24;
  void *__buf_25;
  void *__buf_26;
  long lVar10;
  long lVar11;
  int __fd;
  ulong uVar12;
  ulong in_R9;
  uint uVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float xmin;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float xmax;
  float xmax_00;
  float fVar24;
  float fVar25;
  RenderSampleAnalyzeResult RVar26;
  allocator<char> local_ad8;
  allocator<char> local_ad7;
  allocator<char> local_ad6;
  allocator<char> local_ad5;
  allocator<char> local_ad4;
  allocator<char> local_ad3;
  allocator<char> local_ad2;
  allocator<char> local_ad1;
  allocator<char> local_ad0;
  allocator<char> local_acf;
  allocator<char> local_ace;
  allocator<char> local_acd;
  allocator<char> local_acc;
  allocator<char> local_acb;
  allocator<char> local_aca;
  allocator<char> local_ac9;
  allocator<char> local_ac8;
  allocator<char> local_ac7;
  allocator<char> local_ac6;
  allocator<char> local_ac5;
  allocator<char> local_ac4;
  allocator<char> local_ac3;
  allocator<char> local_ac2;
  allocator<char> local_ac1;
  allocator<char> local_ac0;
  allocator<char> local_abf;
  allocator<char> local_abe;
  allocator<char> local_abd;
  allocator<char> local_abc;
  allocator<char> local_abb;
  allocator<char> local_aba;
  allocator<char> local_ab9;
  allocator<char> local_ab8;
  allocator<char> local_ab7;
  allocator<char> local_ab6;
  allocator<char> local_ab5;
  LineParametersWithConfidence theilSenFitting;
  LineParametersWithConfidence contributionFitting;
  vector<float,_std::allocator<float>_> processingRates;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  ScopedLogSection section_2;
  string local_968;
  string local_948;
  string local_928;
  string local_908;
  string local_8e8;
  string local_8c8;
  string local_8a8;
  string local_888;
  string local_868;
  ScopedLogSection section_1;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  LogNumber<float> local_798;
  LogNumber<float> local_730;
  ScopedLogSection section;
  LogNumber<float> local_6a8;
  LogNumber<float> local_640;
  LogNumber<float> local_5d8;
  LogNumber<float> local_570;
  LogNumber<float> local_508;
  LogNumber<float> local_4a0;
  LogNumber<float> local_438;
  LogNumber<float> local_3d0;
  StatsType resultStats;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>>
            (&theilSenFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
              *)0x20,in_RCX);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&values,((long)(samples->
                            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(samples->
                           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                           )._M_impl.super__Vector_impl_data._M_start) / 0x38,
             (allocator_type *)&processingRates);
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x38;
  uVar12 = 0;
  uVar5 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar5 = uVar12;
  }
  pdVar6 = &(pRVar1->duration).fitResponseDuration;
  for (; uVar5 != uVar12; uVar12 = uVar12 + 1) {
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar12] = *pdVar6;
    pdVar6 = pdVar6 + 7;
  }
  std::vector<float,_std::allocator<float>_>::vector
            (&processingRates,uVar3,(allocator_type *)&local_798);
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x38;
  uVar12 = 0;
  uVar5 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar5 = uVar12;
  }
  piVar7 = &pRVar1->renderDataSize;
  for (; uVar5 != uVar12; uVar12 = uVar12 + 1) {
    uVar3 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12];
    if ((long)uVar3 < 0) {
      in_R9 = uVar3 >> 1;
    }
    *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + uVar12 * 4) =
         (float)*piVar7 / (((float)uVar3 / 1000.0) / 1000.0);
    piVar7 = piVar7 + 0xe;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_),
             CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_));
  resultStats.medianRate =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.5);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&processingRates.super__Vector_base<float,_std::allocator<float>_>);
  std::vector<float,_std::allocator<float>_>::vector
            (&processingRates,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x38,(allocator_type *)&local_798);
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x38;
  uVar12 = 0;
  uVar5 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar5 = uVar12;
  }
  piVar7 = &pRVar1->renderDataSize;
  for (; uVar5 != uVar12; uVar12 = uVar12 + 1) {
    uVar3 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12];
    if ((long)uVar3 < 0) {
      in_R9 = uVar3 >> 1;
    }
    *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + uVar12 * 4) =
         (float)uVar3 - ((float)*piVar7 * theilSenFitting.coefficient + theilSenFitting.offset);
    piVar7 = piVar7 + 0xe;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_),
             CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_));
  resultStats.maxDiffTime =
       *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._4_4_,
                           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._0_4_) + -4);
  resultStats.maxDiff9DecileTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.9);
  resultStats.medianDiffTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.5);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&processingRates.super__Vector_base<float,_std::allocator<float>_>);
  std::vector<float,_std::allocator<float>_>::vector
            (&processingRates,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x38,(allocator_type *)&local_798);
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x38;
  uVar12 = 0;
  uVar5 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar5 = uVar12;
  }
  piVar7 = &pRVar1->renderDataSize;
  for (; uVar5 != uVar12; uVar12 = uVar12 + 1) {
    fVar15 = (float)*piVar7 * theilSenFitting.coefficient + theilSenFitting.offset;
    fVar22 = 0.0;
    if (1.0 <= fVar15) {
      uVar3 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12];
      if ((long)uVar3 < 0) {
        in_R9 = uVar3 >> 1;
      }
      fVar22 = ((float)uVar3 - fVar15) / fVar15;
    }
    *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + uVar12 * 4) = fVar22;
    piVar7 = piVar7 + 0xe;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_),
             CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_,
                      processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_));
  resultStats.maxRelDiffTime =
       *(float *)(CONCAT44(processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._4_4_,
                           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._0_4_) + -4);
  resultStats.max9DecileRelDiffTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.9);
  resultStats.medianRelDiffTime =
       linearSample<float>((vector<float,_std::allocator<float>_> *)
                           &processingRates.super__Vector_base<float,_std::allocator<float>_>,0.5);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&processingRates.super__Vector_base<float,_std::allocator<float>_>);
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
  uVar5 = *values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = uVar5;
  if ((long)uVar5 < 0) {
    uVar3 = (ulong)((uint)uVar5 & 1) | uVar5 >> 1;
  }
  resultStats.result.minTime = (float)uVar5;
  uVar5 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  if ((long)uVar5 < 0) {
    uVar3 = uVar5 >> 1;
  }
  resultStats.result.maxTime = (float)uVar5;
  resultStats.result.medianTime =
       linearSample<unsigned_long>
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.5);
  resultStats.result.min2DecileTime =
       linearSample<unsigned_long>
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.1);
  resultStats.result.max9DecileTime =
       linearSample<unsigned_long>
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,0.9);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>>
            (&resultStats.render,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
              *)0x0,uVar3);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>>
            (&resultStats.read,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
              *)0x8,uVar3);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>>
            (&resultStats.total,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
              *)0x18,uVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&values,"Samples",(allocator<char> *)&local_798);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&processingRates,"Samples",(allocator<char> *)&local_730);
  psVar8 = (string *)&processingRates;
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&values,psVar8);
  std::__cxx11::string::~string((string *)&processingRates);
  std::__cxx11::string::~string((string *)&values);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,"Samples",(allocator<char> *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_570,"Samples",(allocator<char> *)&local_b8);
  tcu::LogSampleList::LogSampleList((LogSampleList *)&local_4a0,&local_508.m_name,&local_570.m_name)
  ;
  __fd = (int)log;
  tcu::LogSampleList::write((LogSampleList *)&local_4a0,__fd,__buf,(size_t)psVar8);
  tcu::TestLog::startSampleInfo(log);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d8,"DataSize",(allocator<char> *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_640,"Data processed",(allocator<char> *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,"bytes",(allocator<char> *)&local_118);
  pLVar9 = &local_6a8;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&values,&local_5d8.m_name,&local_640.m_name,&pLVar9->m_name,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::LogValueInfo::write((LogValueInfo *)&values,__fd,__buf_00,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contributionFitting,"VertexCount",(allocator<char> *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section_1,"Number of vertices",(allocator<char> *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_868,"vertices",(allocator<char> *)&local_178);
  psVar8 = &local_868;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&processingRates,(string *)&contributionFitting,(string *)&section_1,
             psVar8,QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::LogValueInfo::write((LogValueInfo *)&processingRates,__fd,__buf_01,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_888,"TotalTime",(allocator<char> *)&local_198);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a8,"Total time",(allocator<char> *)&local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c8,"us",(allocator<char> *)&local_1d8);
  psVar8 = &local_8c8;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_798,&local_888,&local_8a8,psVar8,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_798,__fd,__buf_02,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8e8,"DrawCallTime",(allocator<char> *)&local_1f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_908,"Draw call time",(allocator<char> *)&local_218);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_928,"us",(allocator<char> *)&local_238);
  psVar8 = &local_928;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_730,&local_8e8,&local_908,psVar8,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_730,__fd,__buf_03,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_948,"ReadTime",(allocator<char> *)&local_258);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_968,"ReadPixels time",(allocator<char> *)&local_278);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7b8,"us",(allocator<char> *)&local_298);
  psVar8 = &local_7b8;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_3d0,&local_948,&local_968,psVar8,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_3d0,__fd,__buf_04,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d8,"FitResidual",(allocator<char> *)&local_2b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f8,"Fit residual",(allocator<char> *)&local_2d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_818,"us",(allocator<char> *)&local_2f8);
  psVar8 = &local_818;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_438,&local_7d8,&local_7f8,psVar8,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_438,__fd,__buf_05,(size_t)psVar8);
  tcu::TestLog::endSampleInfo(log);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_438);
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::__cxx11::string::~string((string *)&local_7d8);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_948);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_730);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::string::~string((string *)&local_8e8);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_798);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::__cxx11::string::~string((string *)&local_888);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&processingRates);
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&section_1);
  std::__cxx11::string::~string((string *)&contributionFitting);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&values);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_640);
  std::__cxx11::string::~string((string *)&local_5d8);
  tcu::LogSampleList::~LogSampleList((LogSampleList *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_508);
  lVar11 = 0;
  for (lVar10 = 0;
      pRVar1 = (samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      lVar10 < (int)(((long)(samples->
                            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x38);
      lVar10 = lVar10 + 1) {
    uVar5 = *(ulong *)((long)&(pRVar1->duration).fitResponseDuration + lVar11);
    fVar15 = (float)*(int *)((long)&pRVar1->renderDataSize + lVar11) * theilSenFitting.coefficient +
             theilSenFitting.offset;
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._8_16_ = ZEXT416(0);
    values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)log;
    pSVar4 = tcu::SampleBuilder::operator<<
                       ((SampleBuilder *)&values,*(int *)((long)&pRVar1->renderDataSize + lVar11));
    pSVar4 = tcu::SampleBuilder::operator<<
                       (pSVar4,*(int *)((long)&((samples->
                                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->
                                               numVertices + lVar11));
    pSVar4 = tcu::SampleBuilder::operator<<
                       (pSVar4,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).renderReadDuration + lVar11));
    pSVar4 = tcu::SampleBuilder::operator<<
                       (pSVar4,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).renderDuration + lVar11));
    pSVar4 = tcu::SampleBuilder::operator<<
                       (pSVar4,*(int *)((long)&(((samples->
                                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               duration).readDuration + lVar11));
    pSVar4 = tcu::SampleBuilder::operator<<(pSVar4,(float)uVar5 - fVar15);
    tcu::SampleBuilder::operator<<(pSVar4,(EndSampleToken *)&tcu::TestLog::EndSample);
    std::_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::
    ~_Vector_base((_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>
                   *)&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
    lVar11 = lVar11 + 0x38;
  }
  tcu::TestLog::endSampleList(log);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&values,"Contribution",(allocator<char> *)&local_798);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&processingRates,"Contributions",(allocator<char> *)&local_730);
  psVar8 = (string *)&processingRates;
  tcu::ScopedLogSection::ScopedLogSection(&section_1,log,(string *)&values,psVar8);
  std::__cxx11::string::~string((string *)&processingRates);
  std::__cxx11::string::~string((string *)&values);
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>>
            (&contributionFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
              *)0x0,(offset_in_SampleType_to_deUint64)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_730,"DrawCallConstantCost",(allocator<char> *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"DrawCall: Approximated contant cost",
             (allocator<char> *)&local_888);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"us",(allocator<char> *)&local_8a8);
  pLVar9 = &local_438;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,&local_730.m_name,&local_3d0.m_name,&pLVar9->m_name,
             QP_KEY_TAG_TIME,contributionFitting.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_06,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a0,"DrawCallLinearCost",(allocator<char> *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,"DrawCall: Approximated linear cost",(allocator<char> *)&local_8e8
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_570,"us / MB",(allocator<char> *)&local_908);
  pLVar9 = &local_570;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_4a0.m_name,&local_508.m_name,
             &pLVar9->m_name,QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_07,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d8,"DrawCallMedianCost",(allocator<char> *)&local_928);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_640,"DrawCall: Median cost",(allocator<char> *)&local_948);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,"us",(allocator<char> *)&local_968);
  pLVar9 = &local_6a8;
  tcu::LogNumber<float>::LogNumber
            (&local_798,&local_5d8.m_name,&local_640.m_name,&pLVar9->m_name,QP_KEY_TAG_TIME,
             resultStats.render.medianTime);
  tcu::LogNumber<float>::write(&local_798,__fd,__buf_08,(size_t)pLVar9);
  tcu::LogNumber<float>::~LogNumber(&local_798);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_640);
  std::__cxx11::string::~string((string *)&local_5d8);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_4a0);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_730);
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>>
            (&contributionFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
              *)0x8,(offset_in_SampleType_to_deUint64)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_730,"ReadConstantCost",(allocator<char> *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"Read: Approximated contant cost",(allocator<char> *)&local_888);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"us",(allocator<char> *)&local_8a8);
  pLVar9 = &local_438;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,&local_730.m_name,&local_3d0.m_name,&pLVar9->m_name,
             QP_KEY_TAG_TIME,contributionFitting.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_09,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a0,"ReadLinearCost",(allocator<char> *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,"Read: Approximated linear cost",(allocator<char> *)&local_8e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_570,"us / MB",(allocator<char> *)&local_908);
  pLVar9 = &local_570;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_4a0.m_name,&local_508.m_name,
             &pLVar9->m_name,QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_10,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d8,"ReadMedianCost",(allocator<char> *)&local_928);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_640,"Read: Median cost",(allocator<char> *)&local_948);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,"us",(allocator<char> *)&local_968);
  pLVar9 = &local_6a8;
  tcu::LogNumber<float>::LogNumber
            (&local_798,&local_5d8.m_name,&local_640.m_name,&pLVar9->m_name,QP_KEY_TAG_TIME,
             resultStats.read.medianTime);
  tcu::LogNumber<float>::write(&local_798,__fd,__buf_11,(size_t)pLVar9);
  tcu::LogNumber<float>::~LogNumber(&local_798);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_640);
  std::__cxx11::string::~string((string *)&local_5d8);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_4a0);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_730);
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>>
            (&contributionFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
              *)0x18,(offset_in_SampleType_to_deUint64)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_730,"TotalConstantCost",(allocator<char> *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"Total: Approximated contant cost",(allocator<char> *)&local_888);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"us",(allocator<char> *)&local_8a8);
  pLVar9 = &local_438;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,&local_730.m_name,&local_3d0.m_name,&pLVar9->m_name,
             QP_KEY_TAG_TIME,contributionFitting.offset);
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_12,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a0,"TotalLinearCost",(allocator<char> *)&local_8c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,"Total: Approximated linear cost",(allocator<char> *)&local_8e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_570,"us / MB",(allocator<char> *)&local_908);
  pLVar9 = &local_570;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_4a0.m_name,&local_508.m_name,
             &pLVar9->m_name,QP_KEY_TAG_TIME,contributionFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_13,(size_t)pLVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d8,"TotalMedianCost",(allocator<char> *)&local_928);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_640,"Total: Median cost",(allocator<char> *)&local_948);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,"us",(allocator<char> *)&local_968);
  pLVar9 = &local_6a8;
  tcu::LogNumber<float>::LogNumber
            (&local_798,&local_5d8.m_name,&local_640.m_name,&pLVar9->m_name,QP_KEY_TAG_TIME,
             resultStats.total.medianTime);
  tcu::LogNumber<float>::write(&local_798,__fd,__buf_14,(size_t)pLVar9);
  tcu::LogNumber<float>::~LogNumber(&local_798);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_640);
  std::__cxx11::string::~string((string *)&local_5d8);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_4a0);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_730);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&values,"Results",(allocator<char> *)&local_798);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&processingRates,"Results",(allocator<char> *)&local_730);
  tcu::ScopedLogSection::ScopedLogSection
            (&section_2,log,(string *)&values,(string *)&processingRates);
  std::__cxx11::string::~string((string *)&processingRates);
  std::__cxx11::string::~string((string *)&values);
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar16 = (float)((pRVar2[-1].renderDataSize + pRVar1->renderDataSize) / 2);
  fVar23 = theilSenFitting.coefficient * fVar16;
  fVar17 = theilSenFitting.offset + fVar23;
  uVar5 = ((long)pRVar2 - (long)pRVar1) / 0x38;
  uVar5 = (long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) / 2;
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>>
            ((LineParametersWithConfidence *)&values,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
              *)0x0,(int)uVar5,0x20,in_R9);
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>>
            ((LineParametersWithConfidence *)&processingRates,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
              *)(uVar5 & 0xffffffff),
             (int)(((long)(samples->
                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(samples->
                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x38),0x20,in_R9);
  fVar15 = processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  pRVar1 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar18 = (float)pRVar1->renderDataSize;
  fVar22 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  xmax = (float)pRVar2[-1].renderDataSize;
  local_48 = ZEXT416((uint)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_finish._4_4_);
  local_58 = ZEXT416((uint)processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._4_4_);
  fVar19 = getAreaBetweenLines(fVar18,xmax,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            ((LineParametersWithConfidence *)&values,samples,0,
             (int)(((long)pRVar2 - (long)pRVar1) / 0x38),2,0x20);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            ((LineParametersWithConfidence *)&processingRates,samples,1,
             (int)(((long)(samples->
                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(samples->
                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x38),2,0x20);
  xmin = (float)((samples->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)->renderDataSize;
  fVar25 = values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  xmax_00 = (float)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish[-1].renderDataSize;
  local_68 = ZEXT416((uint)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_finish._4_4_);
  local_78 = ZEXT416((uint)processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish._4_4_);
  fVar20 = getAreaBetweenLines(xmin,xmax_00,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               values.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_,
                               processingRates.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contributionFitting,"ResultLinearity",&local_ab5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section_1,"Sample linearity",&local_ab6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_868,"%",&local_ab7);
  fVar21 = (float)local_48._0_4_ * fVar18 + fVar22;
  fVar24 = (float)local_58._0_4_ * fVar18 + fVar15;
  uVar13 = -(uint)(fVar21 <= fVar24);
  fVar22 = (float)local_48._0_4_ * xmax + fVar22;
  fVar15 = (float)local_58._0_4_ * xmax + fVar15;
  uVar14 = -(uint)(fVar15 <= fVar22);
  fVar15 = ((float)(~uVar14 & (uint)fVar15 | (uint)fVar22 & uVar14) -
           (float)(~uVar13 & (uint)fVar24 | (uint)fVar21 & uVar13)) * (xmax - fVar18);
  fVar22 = (float)(~-(uint)(fVar15 < 1e-06) & (uint)(1.0 - fVar19 / fVar15));
  fVar15 = 1.0;
  if (fVar22 <= 1.0) {
    fVar15 = fVar22;
  }
  psVar8 = &local_868;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&values,(string *)&contributionFitting,(string *)&section_1,psVar8,
             QP_KEY_TAG_QUALITY,(float)(~-(uint)(fVar22 < 0.0) & (uint)(fVar15 * 100.0)));
  tcu::LogNumber<float>::write((LogNumber<float> *)&values,__fd,__buf_15,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_888,"SampleTemporalStability",&local_ab8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a8,"Sample temporal stability",&local_ab9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"%",&local_aba);
  fVar15 = (float)local_68._0_4_ * xmin + fVar25;
  fVar22 = (float)local_78._0_4_ * xmin +
           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  uVar13 = -(uint)(fVar15 <= fVar22);
  fVar25 = (float)local_68._0_4_ * xmax_00 + fVar25;
  fVar18 = (float)local_78._0_4_ * xmax_00 +
           processingRates.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  uVar14 = -(uint)(fVar18 <= fVar25);
  fVar15 = ((float)(~uVar14 & (uint)fVar18 | (uint)fVar25 & uVar14) -
           (float)(~uVar13 & (uint)fVar22 | (uint)fVar15 & uVar13)) * (xmax_00 - xmin);
  fVar22 = (float)(~-(uint)(fVar15 < 1e-06) & (uint)(1.0 - fVar20 / fVar15));
  fVar15 = 1.0;
  if (fVar22 <= 1.0) {
    fVar15 = fVar22;
  }
  psVar8 = &local_8c8;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&processingRates,&local_888,&local_8a8,psVar8,QP_KEY_TAG_QUALITY,
             (float)(~-(uint)(fVar22 < 0.0) & (uint)(fVar15 * 100.0)));
  tcu::LogNumber<float>::write((LogNumber<float> *)&processingRates,__fd,__buf_16,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8e8,"ApproximatedConstantCost",&local_abb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_908,"Approximated contant cost",&local_abc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_928,"us",&local_abd);
  psVar8 = &local_928;
  tcu::LogNumber<float>::LogNumber
            (&local_798,&local_8e8,&local_908,psVar8,QP_KEY_TAG_TIME,theilSenFitting.offset);
  tcu::LogNumber<float>::write(&local_798,__fd,__buf_17,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_948,"ApproximatedConstantCostConfidence60Lower",&local_abe);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_968,"Approximated contant cost 60% confidence lower limit",&local_abf)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b8,"us",&local_ac0);
  psVar8 = &local_7b8;
  tcu::LogNumber<float>::LogNumber
            (&local_730,&local_948,&local_968,psVar8,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceLower);
  tcu::LogNumber<float>::write(&local_730,__fd,__buf_18,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d8,"ApproximatedConstantCostConfidence60Upper",&local_ac1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f8,"Approximated contant cost 60% confidence upper limit",&local_ac2)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_818,"us",&local_ac3);
  psVar8 = &local_818;
  tcu::LogNumber<float>::LogNumber
            (&local_3d0,&local_7d8,&local_7f8,psVar8,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceUpper);
  tcu::LogNumber<float>::write(&local_3d0,__fd,__buf_19,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section,"ApproximatedLinearCost",&local_ac4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Approximated linear cost",&local_ac5);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"us / MB",&local_ac6);
  psVar8 = &local_b8;
  tcu::LogNumber<float>::LogNumber
            (&local_438,(string *)&section,&local_98,psVar8,QP_KEY_TAG_TIME,
             theilSenFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write(&local_438,__fd,__buf_20,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"ApproximatedLinearCostConfidence60Lower",&local_ac7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"Approximated linear cost 60% confidence lower limit",&local_ac8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"us / MB",&local_ac9);
  psVar8 = &local_118;
  tcu::LogNumber<float>::LogNumber
            (&local_4a0,&local_d8,&local_f8,psVar8,QP_KEY_TAG_TIME,
             theilSenFitting.coefficientConfidenceLower * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write(&local_4a0,__fd,__buf_21,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"ApproximatedLinearCostConfidence60Upper",&local_aca);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"Approximated linear cost 60% confidence upper limit",&local_acb);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"us / MB",&local_acc);
  psVar8 = &local_178;
  tcu::LogNumber<float>::LogNumber
            (&local_508,&local_138,&local_158,psVar8,QP_KEY_TAG_TIME,
             theilSenFitting.coefficientConfidenceUpper * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write(&local_508,__fd,__buf_22,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"ApproximatedProcessRate",&local_acd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Approximated processing rate",&local_ace);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"MB / s",&local_acf);
  fVar15 = fVar16 / ((fVar17 / 1000.0) / 1000.0);
  psVar8 = &local_1d8;
  tcu::LogNumber<float>::LogNumber
            (&local_570,&local_198,&local_1b8,psVar8,QP_KEY_TAG_PERFORMANCE,
             fVar15 * 0.0009765625 * 0.0009765625);
  tcu::LogNumber<float>::write(&local_570,__fd,__buf_23,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"ApproximatedProcessRateNoConstant",&local_ad0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"Approximated processing rate without constant cost",&local_ad1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"MB / s",&local_ad2);
  psVar8 = &local_238;
  tcu::LogNumber<float>::LogNumber
            (&local_5d8,&local_1f8,&local_218,psVar8,QP_KEY_TAG_PERFORMANCE,
             (fVar16 / ((fVar23 / 1000.0) / 1000.0)) * 0.0009765625 * 0.0009765625);
  tcu::LogNumber<float>::write(&local_5d8,__fd,__buf_24,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"SampleMedianTime",&local_ad3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"Median sample time",&local_ad4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"us",&local_ad5);
  psVar8 = &local_298;
  tcu::LogNumber<float>::LogNumber
            (&local_640,&local_258,&local_278,psVar8,QP_KEY_TAG_TIME,resultStats.result.medianTime);
  tcu::LogNumber<float>::write(&local_640,__fd,__buf_25,(size_t)psVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"SampleMedianProcess",&local_ad6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,"Median processing rate",&local_ad7);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"MB / s",&local_ad8);
  psVar8 = &local_2f8;
  tcu::LogNumber<float>::LogNumber
            (&local_6a8,&local_2b8,&local_2d8,psVar8,QP_KEY_TAG_PERFORMANCE,
             resultStats.medianRate * 0.0009765625 * 0.0009765625);
  tcu::LogNumber<float>::write(&local_6a8,__fd,__buf_26,(size_t)psVar8);
  tcu::LogNumber<float>::~LogNumber(&local_6a8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  tcu::LogNumber<float>::~LogNumber(&local_640);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  tcu::LogNumber<float>::~LogNumber(&local_5d8);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  tcu::LogNumber<float>::~LogNumber(&local_570);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  tcu::LogNumber<float>::~LogNumber(&local_508);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  tcu::LogNumber<float>::~LogNumber(&local_4a0);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  tcu::LogNumber<float>::~LogNumber(&local_438);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&section);
  tcu::LogNumber<float>::~LogNumber(&local_3d0);
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::__cxx11::string::~string((string *)&local_7d8);
  tcu::LogNumber<float>::~LogNumber(&local_730);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_948);
  tcu::LogNumber<float>::~LogNumber(&local_798);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::string::~string((string *)&local_8e8);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&processingRates);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::__cxx11::string::~string((string *)&local_888);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&values);
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&section_1);
  std::__cxx11::string::~string((string *)&contributionFitting);
  tcu::ScopedLogSection::~ScopedLogSection(&section_2);
  RVar26.renderRateAtRange = fVar15;
  RVar26.renderRateMedian = resultStats.medianRate;
  RVar26.renderRateAtInfinity = resultStats.medianRate;
  return RVar26;
}

Assistant:

static RenderSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<RenderSampleResult<SampleType> >& samples)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedProcessingRate;
	float													approximatedProcessingRateNoConstant;

	// output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logFirstRenderContribution(log, samples, resultStats);
		logUploadContribution(log, samples, resultStats);
		logRenderContribution(log, samples, resultStats);
		logSecondRenderContribution(log, samples, resultStats);
		logReadContribution(log, samples, resultStats);
		logTotalContribution(log, samples, resultStats);
	}

	// print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianDataSize						= (samples.front().renderDataSize + samples.back().renderDataSize) / 2;
		const float	approximatedRenderTime				= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	approximatedRenderTimeNoConstant	= (theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedProcessingRateNoConstant			= (float)medianDataSize / approximatedRenderTimeNoConstant;
		approximatedProcessingRate						= (float)medianDataSize / approximatedRenderTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRate", "Approximated processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRateNoConstant", "Approximated processing rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianProcess", "Median processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated render rate
	{
		RenderSampleAnalyzeResult result;

		result.renderRateMedian		= resultStats.medianRate;
		result.renderRateAtRange	= approximatedProcessingRate;
		result.renderRateAtInfinity = approximatedProcessingRateNoConstant;

		return result;
	}
	return RenderSampleAnalyzeResult();
}